

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObserverManager.h
# Opt level: O2

void __thiscall
ObserverManager::notify<FooBarProtocol,std::__cxx11::string_const&,char_const*>
          (ObserverManager *this,offset_in_FooBarProtocol_to_subr method,char *args)

{
  pointer ppVar1;
  iterator iVar2;
  __node_base *p_Var3;
  pointer ppVar4;
  long *plVar5;
  ObserverManager *pOVar6;
  vector<std::pair<FooBarProtocol_*,_unsigned_long>,_std::allocator<std::pair<FooBarProtocol_*,_unsigned_long>_>_>
  observers;
  allocator local_79;
  offset_in_FooBarProtocol_to_subr local_78;
  char *local_70;
  _Vector_base<std::pair<FooBarProtocol_*,_unsigned_long>,_std::allocator<std::pair<FooBarProtocol_*,_unsigned_long>_>_>
  local_68;
  pair<FooBarProtocol_*,_unsigned_long> local_50 [2];
  
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var3 = &ObserverContainer<FooBarProtocol>::observers._M_h._M_before_begin;
  local_78 = method;
  local_70 = args;
  while (ppVar1 = local_68._M_impl.super__Vector_impl_data._M_finish, p_Var3 = p_Var3->_M_nxt,
        p_Var3 != (__node_base *)0x0) {
    local_50[0].first = *(FooBarProtocol **)(p_Var3 + 1);
    local_50[0].second = (unsigned_long)((_Hash_node_base *)((long)local_50[0].first + 8))->_M_nxt;
    std::
    vector<std::pair<FooBarProtocol*,unsigned_long>,std::allocator<std::pair<FooBarProtocol*,unsigned_long>>>
    ::emplace_back<std::pair<FooBarProtocol*,unsigned_long>>
              ((vector<std::pair<FooBarProtocol*,unsigned_long>,std::allocator<std::pair<FooBarProtocol*,unsigned_long>>>
                *)&local_68,local_50);
  }
  for (ppVar4 = local_68._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar1;
      ppVar4 = ppVar4 + 1) {
    iVar2 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>,_std::allocator<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&unsubscribeMap._M_h,&ppVar4->second);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>,_false>
        ._M_cur != (__node_type *)0x0) {
      plVar5 = (long *)((long)&(ppVar4->first->super_BaseObserverProtocol).
                               _vptr_BaseObserverProtocol + local_78);
      pOVar6 = this;
      if (((ulong)this & 1) != 0) {
        pOVar6 = *(ObserverManager **)(this + *plVar5 + -1);
      }
      std::__cxx11::string::string((string *)local_50,local_70,&local_79);
      (*(code *)pOVar6)(plVar5,local_50);
      std::__cxx11::string::~string((string *)local_50);
    }
  }
  std::
  _Vector_base<std::pair<FooBarProtocol_*,_unsigned_long>,_std::allocator<std::pair<FooBarProtocol_*,_unsigned_long>_>_>
  ::~_Vector_base(&local_68);
  return;
}

Assistant:

static void notify(void (P::*method)(MethodArgumentTypes...), ActualArgumentTypes... args) {
        std::vector<std::pair<P*, BaseObserverProtocol::id_t>> observers;
        for (const auto& o : ObserverContainer<P>::observers) {
            observers.push_back(std::make_pair(o, o->observerId));
        }

        for (const auto& p : observers) {
            if (unsubscribeMap.find(p.second) == std::end(unsubscribeMap)) {
                continue;
            }
            (p.first->*method)(args...);
        }
    }